

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

void __thiscall StackSolver::solve(StackSolver *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pSVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int varnum;
  int iVar8;
  long lVar9;
  ulong uVar10;
  value_type_conflict2 local_34;
  
  piVar3 = (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_34 = 0xffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->soln,
             (long)(this->vnlist).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vnlist).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_34);
  duplicate(this);
  propagate(this,0,0);
  uVar5 = (int)((long)(this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x55555555;
  iVar7 = uVar5 + 2;
  do {
    if ((int)uVar5 < 1) {
      return;
    }
    iVar8 = 0;
    lVar9 = 8;
    uVar10 = (ulong)(uVar5 & 0x7fffffff);
    do {
      pSVar4 = (this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = *(int *)((long)pSVar4 + lVar9 + -8);
      varnum = *(int *)((long)pSVar4 + lVar9 + -4);
      iVar2 = piVar3[iVar1];
      iVar6 = piVar3[varnum];
      if (iVar2 == 0xffff) {
        if (iVar6 == 0xffff) {
          iVar8 = iVar8 + 1;
        }
        else {
          iVar6 = iVar6 + *(int *)((long)&pSVar4->var1 + lVar9);
          varnum = iVar1;
LAB_002df858:
          propagate(this,varnum,iVar6);
        }
      }
      else if (iVar6 == 0xffff) {
        iVar6 = iVar2 - *(int *)((long)&pSVar4->var1 + lVar9);
        goto LAB_002df858;
      }
      lVar9 = lVar9 + 0xc;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    if (iVar8 == iVar7) {
      return;
    }
    iVar7 = iVar8;
    if (iVar8 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void StackSolver::solve(void)

{
  // Use guesses to resolve subsystems not uniquely determined
  int4 i,size,var1,var2,count,lastcount;

  soln.clear();
  soln.resize(vnlist.size(),65535); // Initialize solutions vector
  duplicate();			// Duplicate and sort the equations

  propagate(0,0);		// We know one variable
  size = guess.size();
  lastcount = size+2;
  do {
    count = 0;
    for(i=0;i<size;++i) {
      var1 = guess[i].var1;
      var2 = guess[i].var2;
      if ((soln[var1]!=65535)&&(soln[var2]==65535))
	propagate(var2,soln[var1]-guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]!=65535))
	propagate(var1,soln[var2]+guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]==65535))
	count += 1;
    }
    if (count == lastcount) break;
    lastcount = count;
  } while(count > 0);
}